

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

BGZF * bgzf_hopen(hFILE *hfp,char *mode)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  BGZF *local_28;
  BGZF *fp;
  char *mode_local;
  hFILE *hfp_local;
  
  uVar2 = compressBound(0xff00);
  if (0xffff < uVar2) {
    __assert_fail("compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                  ,0xd8,"BGZF *bgzf_hopen(hFILE *, const char *)");
  }
  pcVar3 = strchr(mode,0x72);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strchr(mode,0x77);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(mode,0x61), pcVar3 == (char *)0x0)) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return (BGZF *)0x0;
    }
    local_28 = bgzf_write_init(mode);
  }
  else {
    local_28 = bgzf_read_init(hfp);
    if (local_28 == (BGZF *)0x0) {
      return (BGZF *)0x0;
    }
  }
  local_28->fp = hfp;
  uVar1 = ed_is_big();
  *(uint *)local_28 = *(uint *)local_28 & 0xfff3ffff | (uVar1 & 3) << 0x12;
  return local_28;
}

Assistant:

BGZF *bgzf_hopen(hFILE *hfp, const char *mode)
{
    BGZF *fp = NULL;
    assert(compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE);
    if (strchr(mode, 'r')) {
        fp = bgzf_read_init(hfp);
        if (fp == NULL) return NULL;
    } else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        fp = bgzf_write_init(mode);
    }
    else { errno = EINVAL; return 0; }

    fp->fp = hfp;
    fp->is_be = ed_is_big();
    return fp;
}